

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O1

bool __thiscall
ExternalSigner::SignTransaction
          (ExternalSigner *this,PartiallySignedTransaction *psbtx,string *error)

{
  uchar *puVar1;
  uchar *puVar2;
  PSBTInput *pPVar3;
  pointer pcVar4;
  _Optional_payload_base<unsigned_int> _Var5;
  Span<const_unsigned_char> input;
  Span<const_unsigned_char> input_00;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  UniValue *pUVar8;
  string *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  __normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_> __it;
  char *pcVar13;
  undefined8 uVar14;
  __normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_> __it_00;
  __normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_> __it_01;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> parsed_m_fingerprint;
  PartiallySignedTransaction signer_psbtx;
  UniValue signer_result;
  string signer_psbt_error;
  string stdinStr;
  string command;
  pointer local_250 [2];
  pointer local_240;
  DataStream local_238;
  string local_218;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [56];
  _Rb_tree_node_base local_1b0;
  pointer local_190;
  vector<PSBTInput,_std::allocator<PSBTInput>_> vStack_188;
  vector<PSBTOutput,_std::allocator<PSBTOutput>_> local_170;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_158;
  _Storage<unsigned_int,_true> local_128;
  uint uStack_124;
  _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
  local_120;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<UniValue,_std::allocator<UniValue>_> local_b0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_238.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.m_read_pos = 0;
  local_238.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PartiallySignedTransaction::Serialize<DataStream>(psbtx,&local_238);
  hex_str._M_str = (this->m_fingerprint)._M_dataplus._M_p;
  hex_str._M_len = (this->m_fingerprint)._M_string_length;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_250,hex_str);
  __it_00._M_current =
       (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
       super__Vector_impl_data._M_start;
  pPVar3 = (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar12 = ((long)pPVar3 - (long)__it_00._M_current >> 5) * -0x70a3d70a3d70a3d7 >> 2;
  __it_01._M_current = __it_00._M_current;
  local_1f8._0_8_ = (pointer)local_250;
  if (0 < lVar12) {
    __it_01._M_current = __it_00._M_current + lVar12 * 4;
    lVar12 = lVar12 + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
              ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                            *)local_1f8,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar6) goto LAB_00692822;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
              ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                            *)local_1f8,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar6) goto LAB_00692822;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
              ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                            *)local_1f8,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar6) goto LAB_00692822;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
              ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                            *)local_1f8,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar6) goto LAB_00692822;
      __it_00._M_current = __it_00._M_current + 4;
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  lVar12 = ((long)pPVar3 - (long)__it_01._M_current >> 5) * -0x70a3d70a3d70a3d7;
  if (lVar12 == 1) {
LAB_00692809:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
            ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                          *)local_1f8,__it_01);
    __it._M_current = __it_01._M_current;
    if (!bVar6) {
      __it._M_current = pPVar3;
    }
  }
  else {
    __it._M_current = __it_01._M_current;
    if (lVar12 == 2) {
LAB_006927e4:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
              ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                            *)local_1f8,__it);
      if (!bVar6) {
        __it_01._M_current = __it._M_current + 1;
        goto LAB_00692809;
      }
    }
    else {
      __it._M_current = pPVar3;
      if ((lVar12 == 3) &&
         (bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
                  ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                                *)local_1f8,__it_01), __it._M_current = __it_01._M_current, !bVar6))
      {
        __it._M_current = __it_01._M_current + 1;
        goto LAB_006927e4;
      }
    }
  }
LAB_00692822:
  if (__it._M_current == pPVar3) {
    std::operator+(&local_58,"Signer fingerprint ",&this->m_fingerprint);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_58," does not match any of the inputs:\n");
    puVar2 = local_f0 + 0x10;
    local_f0._0_8_ = (pbVar7->_M_dataplus)._M_p;
    paVar10 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._0_8_ == paVar10) {
      local_f0._16_8_ = paVar10->_M_allocated_capacity;
      aStack_d8._M_allocated_capacity._0_4_ = *(undefined4 *)((long)&pbVar7->field_2 + 8);
      aStack_d8._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
      local_f0._0_8_ = puVar2;
    }
    else {
      local_f0._16_8_ = paVar10->_M_allocated_capacity;
    }
    local_f0._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<unsigned_char_const*>
              ((string *)&local_98,
               local_238.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start + local_238.m_read_pos,
               local_238.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    input_00.m_size = local_98._M_string_length;
    input_00.m_data = (uchar *)local_98._M_dataplus._M_p;
    EncodeBase64_abi_cxx11_(&local_78,input_00);
    pcVar13 = (char *)0xf;
    if ((uchar *)local_f0._0_8_ != puVar2) {
      pcVar13 = (char *)local_f0._16_8_;
    }
    if (pcVar13 < (char *)(local_f0._8_8_ + local_78._M_string_length)) {
      uVar14 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar14 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (char *)(local_f0._8_8_ + local_78._M_string_length)) goto LAB_00692f0a;
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_78,0,0,(char *)local_f0._0_8_,local_f0._8_8_);
    }
    else {
LAB_00692f0a:
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,local_78._M_dataplus._M_p,local_78._M_string_length);
    }
    local_1f8._0_8_ = (pbVar7->_M_dataplus)._M_p;
    paVar10 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ == paVar10) {
      local_1e8._0_8_ = paVar10->_M_allocated_capacity;
      local_1e8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_1f8._0_8_ = (pointer)local_1e8;
    }
    else {
      local_1e8._0_8_ = paVar10->_M_allocated_capacity;
    }
    local_1f8._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    paVar10->_M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
    ;
    if ((pointer)local_1f8._0_8_ != (pointer)local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    if ((uchar *)local_f0._0_8_ != puVar2) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    bVar6 = false;
    goto LAB_00692da3;
  }
  puVar2 = local_f0 + 0x10;
  pcVar4 = (this->m_command)._M_dataplus._M_p;
  local_f0._0_8_ = puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar4,pcVar4 + (this->m_command)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
             " --stdin --fingerprint ");
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     (this->m_fingerprint)._M_dataplus._M_p,(this->m_fingerprint)._M_string_length);
  local_1f8._0_8_ = (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._0_8_ == paVar10) {
    local_1e8._0_8_ = paVar10->_M_allocated_capacity;
    local_1e8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_1f8._0_8_ = (pointer)local_1e8;
  }
  else {
    local_1e8._0_8_ = paVar10->_M_allocated_capacity;
  }
  local_1f8._8_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_78," --chain ",&this->m_chain);
  puVar1 = (((COutPoint *)local_1f8._8_8_)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
           local_78._M_string_length;
  pcVar13 = (char *)0xf;
  if ((pointer)local_1f8._0_8_ != (pointer)local_1e8) {
    pcVar13 = (char *)local_1e8._0_8_;
  }
  if (pcVar13 < puVar1) {
    uVar14 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar14 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < puVar1) goto LAB_0069292b;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_78,0,0,(char *)local_1f8._0_8_,local_1f8._8_8_);
  }
  else {
LAB_0069292b:
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if (paVar11 == paVar10) {
    local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)paVar11;
  }
  local_58._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  paVar10 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar10) {
    operator_delete(local_78._M_dataplus._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1));
  }
  if ((pointer)local_1f8._0_8_ != (pointer)local_1e8) {
    operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
  }
  if ((uchar *)local_f0._0_8_ != puVar2) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
  }
  local_f0._0_8_ = puVar2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)local_f0,
             local_238.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_238.m_read_pos,
             local_238.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  input.m_size = local_f0._8_8_;
  input.m_data = (uchar *)local_f0._0_8_;
  EncodeBase64_abi_cxx11_((string *)local_1f8,input);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8
                      ,0,0,"signtx ",7);
  local_78._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar11) {
    local_78.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_78._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_78._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((pointer)local_1f8._0_8_ != (pointer)local_1e8) {
    operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
  }
  if ((uchar *)local_f0._0_8_ != puVar2) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
  }
  RunCommandParseJSON((UniValue *)local_f0,&local_58,&local_78);
  key._M_str = "error";
  key._M_len = 5;
  pUVar8 = ::UniValue::find_value((UniValue *)local_f0,key);
  if (pUVar8->typ == VSTR) {
    key_00._M_str = "error";
    key_00._M_len = 5;
    pUVar8 = ::UniValue::find_value((UniValue *)local_f0,key_00);
    psVar9 = ::UniValue::get_str_abi_cxx11_(pUVar8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (error,psVar9);
    bVar6 = false;
  }
  else {
    key_01._M_str = "psbt";
    key_01._M_len = 4;
    pUVar8 = ::UniValue::find_value((UniValue *)local_f0,key_01);
    if (pUVar8->typ == VSTR) {
      local_1b0._M_left = &local_1b0;
      local_1e8[0x28] = false;
      local_1b0._M_color = _S_red;
      local_1b0._M_parent = (_Base_ptr)0x0;
      local_158._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_158._M_impl.super__Rb_tree_header._M_header;
      local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_190 = (pointer)0x0;
      vStack_188.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_188.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_188.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_170.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
      uStack_124 = uStack_124 & 0xffffff00;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_120._M_impl.super__Rb_tree_header;
      local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      key_02._M_str = "psbt";
      key_02._M_len = 4;
      local_1b0._M_right = local_1b0._M_left;
      local_158._M_impl.super__Rb_tree_header._M_header._M_right =
           local_158._M_impl.super__Rb_tree_header._M_header._M_left;
      local_120._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pbVar7;
      local_120._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pbVar7;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pUVar8 = ::UniValue::find_value((UniValue *)local_f0,key_02);
      psVar9 = ::UniValue::get_str_abi_cxx11_(pUVar8);
      bVar6 = DecodeBase64PSBT((PartiallySignedTransaction *)local_1f8,psVar9,&local_98);
      if (bVar6) {
        std::_Optional_payload_base<CMutableTransaction>::_M_copy_assign
                  ((_Optional_payload_base<CMutableTransaction> *)psbtx,
                   (_Optional_payload_base<CMutableTransaction> *)local_1f8);
        std::
        _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
        ::operator=(&(psbtx->m_xpubs)._M_t,
                    (_Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                     *)(local_1e8 + 0x30));
        std::vector<PSBTInput,_std::allocator<PSBTInput>_>::operator=(&psbtx->inputs,&vStack_188);
        std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::operator=(&psbtx->outputs,&local_170);
        std::
        _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator=(&(psbtx->unknown)._M_t,&local_158);
        _Var5._4_4_ = uStack_124;
        _Var5._M_payload._M_value = local_128._M_value;
        (psbtx->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> = _Var5;
        std::
        _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
        ::operator=(&(psbtx->m_proprietary)._M_t,&local_120);
      }
      else {
        tinyformat::format<std::__cxx11::string>
                  (&local_218,(tinyformat *)"TX decode failed %s",(char *)&local_98,pbVar7);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
      ::~_Rb_tree(&local_120);
      std::
      _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~_Rb_tree(&local_158);
      std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::~vector(&local_170);
      std::vector<PSBTInput,_std::allocator<PSBTInput>_>::~vector(&vStack_188);
      std::
      _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                   *)(local_1e8 + 0x30));
      std::_Optional_payload_base<CMutableTransaction>::_M_reset
                ((_Optional_payload_base<CMutableTransaction> *)local_1f8);
    }
    else {
      bVar6 = false;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (error,0,error->_M_string_length,"Unexpected result from signer",0x1d);
    }
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._8_8_ != &aStack_d8) {
    operator_delete((void *)local_f0._8_8_,CONCAT44(aStack_d8._4_4_,aStack_d8._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar10) {
    operator_delete(local_78._M_dataplus._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_00692da3:
  if (local_250[0] != (pointer)0x0) {
    operator_delete(local_250[0],(long)local_240 - (long)local_250[0]);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_238);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool ExternalSigner::SignTransaction(PartiallySignedTransaction& psbtx, std::string& error)
{
    // Serialize the PSBT
    DataStream ssTx{};
    ssTx << psbtx;
    // parse ExternalSigner master fingerprint
    std::vector<unsigned char> parsed_m_fingerprint = ParseHex(m_fingerprint);
    // Check if signer fingerprint matches any input master key fingerprint
    auto matches_signer_fingerprint = [&](const PSBTInput& input) {
        for (const auto& entry : input.hd_keypaths) {
            if (std::ranges::equal(parsed_m_fingerprint, entry.second.fingerprint)) return true;
        }
        for (const auto& entry : input.m_tap_bip32_paths) {
            if (std::ranges::equal(parsed_m_fingerprint, entry.second.second.fingerprint)) return true;
        }
        return false;
    };

    if (!std::any_of(psbtx.inputs.begin(), psbtx.inputs.end(), matches_signer_fingerprint)) {
        error = "Signer fingerprint " + m_fingerprint + " does not match any of the inputs:\n" + EncodeBase64(ssTx.str());
        return false;
    }

    const std::string command = m_command + " --stdin --fingerprint " + m_fingerprint + NetworkArg();
    const std::string stdinStr = "signtx " + EncodeBase64(ssTx.str());

    const UniValue signer_result = RunCommandParseJSON(command, stdinStr);

    if (signer_result.find_value("error").isStr()) {
        error = signer_result.find_value("error").get_str();
        return false;
    }

    if (!signer_result.find_value("psbt").isStr()) {
        error = "Unexpected result from signer";
        return false;
    }

    PartiallySignedTransaction signer_psbtx;
    std::string signer_psbt_error;
    if (!DecodeBase64PSBT(signer_psbtx, signer_result.find_value("psbt").get_str(), signer_psbt_error)) {
        error = strprintf("TX decode failed %s", signer_psbt_error);
        return false;
    }

    psbtx = signer_psbtx;

    return true;
}